

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrCore.cpp
# Opt level: O0

AmrCore * __thiscall amrex::AmrCore::operator=(AmrCore *this,AmrCore *rhs)

{
  AmrMesh *in_RSI;
  AmrMesh *in_RDI;
  
  AmrMesh::operator=(in_RSI,in_RDI);
  return (AmrCore *)in_RDI;
}

Assistant:

AmrCore& AmrCore::operator= (AmrCore&& rhs)
{
    AmrMesh::operator=(std::move(rhs));
#ifdef AMREX_PARTICLES
    m_gdb = std::move(rhs.m_gdb);
    m_gdb->m_amrcore = this;
#endif

    return *this;
}